

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O0

void __thiscall QScrollAreaPrivate::updateScrollBars(QScrollAreaPrivate *this)

{
  Alignment align;
  bool bVar1;
  int iVar2;
  int iVar3;
  QLayout *pQVar4;
  int *piVar5;
  QWidget *pQVar6;
  QScrollAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  int vbarWidth;
  QScrollArea *q;
  QSize v;
  QSize m_hfw;
  int h;
  QSize p_hfw;
  QSize max;
  QSize min;
  QSize m;
  QSize p;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  QSize *in_stack_fffffffffffffeb8;
  QAbstractSlider *in_stack_fffffffffffffec0;
  QScrollBar *this_00;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QAbstractScrollArea *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  undefined1 uVar7;
  byte local_d9;
  int local_c4;
  int local_74;
  QSize local_70;
  int local_68;
  QSize local_64;
  QSize local_5c;
  QSize local_54;
  undefined8 local_4c;
  int local_44;
  QSize local_40;
  QSize local_38;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_30;
  undefined1 local_2c [4];
  QSize local_28;
  QSize local_20;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x678d05);
  if (!bVar1) goto LAB_00679434;
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
  ;
  local_18 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QAbstractScrollArea::maximumViewportSize(in_stack_fffffffffffffed0);
  local_20 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x678d80);
  local_20 = qSmartMinSize((QWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
  ;
  local_28 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x678db3);
  memset(local_2c,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x678ddc);
  align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i.
  _2_1_ = in_stack_fffffffffffffeee;
  align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i.
  _0_2_ = in_stack_fffffffffffffeec;
  align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i.
  _3_1_ = in_stack_fffffffffffffeef;
  local_28 = qSmartMaxSize((QWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           align);
  if ((in_RDI->resizable & 1U) != 0) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x678e24);
    pQVar4 = QWidget::layout((QWidget *)0x678e2c);
    if (pQVar4 == (QLayout *)0x0) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x678e76);
      local_30.bits =
           (Bits)QWidget::sizePolicy((QWidget *)
                                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      local_d9 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_30.bits);
    }
    else {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x678e46);
      pQVar4 = QWidget::layout((QWidget *)0x678e4e);
      iVar2 = (*(pQVar4->super_QLayoutItem)._vptr_QLayoutItem[9])(&pQVar4->super_QLayoutItem);
      local_d9 = (byte)iVar2;
    }
    if ((local_d9 & 1) != 0) {
      local_38 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = QSize::expandedTo(in_stack_fffffffffffffeb8,
                                   (QSize *)CONCAT44(in_stack_fffffffffffffeb4,
                                                     in_stack_fffffffffffffeb0));
      local_38 = QSize::boundedTo(in_stack_fffffffffffffeb8,
                                  (QSize *)CONCAT44(in_stack_fffffffffffffeb4,
                                                    in_stack_fffffffffffffeb0));
      pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x678f00);
      iVar2 = QSize::width((QSize *)0x678f12);
      local_44 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,iVar2);
      if ((in_RDI->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAsNeeded) {
        local_4c = (**(code **)(*(long *)&(((in_RDI->super_QAbstractScrollAreaPrivate).vbar)->
                                          super_QAbstractSlider).super_QWidget + 0x70))();
        local_c4 = QSize::width((QSize *)0x678f6a);
        local_54 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        local_5c = QSize::expandedTo(in_stack_fffffffffffffeb8,
                                     (QSize *)CONCAT44(in_stack_fffffffffffffeb4,
                                                       in_stack_fffffffffffffeb0));
        local_54 = QSize::boundedTo(in_stack_fffffffffffffeb8,
                                    (QSize *)CONCAT44(in_stack_fffffffffffffeb4,
                                                      in_stack_fffffffffffffeb0));
        pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x678fce);
        iVar2 = QSize::width((QSize *)0x678fe0);
        iVar2 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,iVar2 - local_c4);
        iVar3 = QSize::height((QSize *)0x679008);
        if (iVar2 <= iVar3) {
          while (iVar2 = local_44, iVar3 = QSize::height((QSize *)0x679030),
                iVar3 < iVar2 && local_c4 != 0) {
            local_c4 = local_c4 + -1;
            piVar5 = QSize::rwidth((QSize *)0x679077);
            *piVar5 = *piVar5 + -1;
            pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x679092);
            iVar2 = QSize::width((QSize *)0x6790a4);
            local_44 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,iVar2);
          }
        }
        QSize::width((QSize *)0x6790cf);
        local_68 = QSize::height((QSize *)0x6790e0);
        qMax<int>(&local_68,&local_44);
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
        local_28 = local_64;
      }
      QSize::width((QSize *)0x67912c);
      local_74 = QSize::height((QSize *)0x67913d);
      qMax<int>(&local_74,&local_44);
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
      local_20 = local_70;
    }
  }
  if ((in_RDI->resizable & 1U) == 0) {
LAB_00679206:
    in_stack_fffffffffffffeee = false;
    uVar7 = in_stack_fffffffffffffeee;
    if ((in_RDI->resizable & 1U) == 0) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x679231);
      QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      QSize::expandedTo(in_stack_fffffffffffffeb8,
                        (QSize *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      in_stack_fffffffffffffeee =
           ::operator==((QSize *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      uVar7 = in_stack_fffffffffffffeee;
    }
  }
  else {
    QSize::expandedTo(in_stack_fffffffffffffeb8,
                      (QSize *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    bVar1 = ::operator==((QSize *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (!bVar1) goto LAB_00679206;
    QSize::boundedTo(in_stack_fffffffffffffeb8,
                     (QSize *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    bVar1 = ::operator==((QSize *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    uVar7 = true;
    if (!bVar1) goto LAB_00679206;
  }
  if ((bool)uVar7 != false) {
    local_10 = local_18;
  }
  if ((in_RDI->resizable & 1U) != 0) {
    pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6792be);
    QSize::expandedTo(in_stack_fffffffffffffeb8,
                      (QSize *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    QSize::boundedTo(in_stack_fffffffffffffeb8,
                     (QSize *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    QWidget::resize((QWidget *)
                    CONCAT17(uVar7,CONCAT16(in_stack_fffffffffffffeee,
                                            CONCAT24(in_stack_fffffffffffffeec,
                                                     in_stack_fffffffffffffee8))),(QSize *)pQVar6);
  }
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x679332);
  QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  iVar2 = QSize::width((QSize *)0x679366);
  QSize::width((QSize *)0x679377);
  QAbstractSlider::setRange
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
  this_00 = (in_RDI->super_QAbstractScrollAreaPrivate).hbar;
  QSize::width((QSize *)0x6793aa);
  QAbstractSlider::setPageStep
            ((QAbstractSlider *)CONCAT44(iVar2,in_stack_fffffffffffffeb0),in_stack_fffffffffffffeac)
  ;
  iVar3 = QSize::height((QSize *)0x6793d7);
  QSize::height((QSize *)0x6793e8);
  QAbstractSlider::setRange(&this_00->super_QAbstractSlider,iVar3,in_stack_fffffffffffffec8);
  QSize::height((QSize *)0x67941b);
  QAbstractSlider::setPageStep
            ((QAbstractSlider *)CONCAT44(iVar2,in_stack_fffffffffffffeb0),in_stack_fffffffffffffeac)
  ;
  updateWidgetPosition
            ((QScrollAreaPrivate *)
             CONCAT17(uVar7,CONCAT16(in_stack_fffffffffffffeee,
                                     CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)))
            );
LAB_00679434:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollAreaPrivate::updateScrollBars()
{
    Q_Q(QScrollArea);
    if (!widget)
        return;
    QSize p = viewport->size();
    QSize m = q->maximumViewportSize();

    QSize min = qSmartMinSize(widget);
    QSize max = qSmartMaxSize(widget);

    if (resizable) {
        if ((widget->layout() ? widget->layout()->hasHeightForWidth() : widget->sizePolicy().hasHeightForWidth())) {
            QSize p_hfw = p.expandedTo(min).boundedTo(max);
            int h = widget->heightForWidth(p_hfw.width());
            // If the height we calculated requires a vertical scrollbar,
            // then we need to constrain the width and calculate the height again,
            // otherwise we end up flipping the scrollbar on and off all the time.
            if (vbarpolicy == Qt::ScrollBarAsNeeded) {
                int vbarWidth = vbar->sizeHint().width();
                QSize m_hfw = m.expandedTo(min).boundedTo(max);
                // is there any point in searching?
                if (widget->heightForWidth(m_hfw.width() - vbarWidth) <= m.height()) {
                    while (h > m.height() && vbarWidth) {
                        --vbarWidth;
                        --m_hfw.rwidth();
                        h = widget->heightForWidth(m_hfw.width());
                    }
                }
                max = QSize(m_hfw.width(), qMax(m_hfw.height(), h));
            }
            min = QSize(p_hfw.width(), qMax(p_hfw.height(), h));
        }
    }

    if ((resizable && m.expandedTo(min) == m && m.boundedTo(max) == m)
        || (!resizable && m.expandedTo(widget->size()) == m))
        p = m; // no scroll bars needed

    if (resizable)
        widget->resize(p.expandedTo(min).boundedTo(max));
    QSize v = widget->size();

    hbar->setRange(0, v.width() - p.width());
    hbar->setPageStep(p.width());
    vbar->setRange(0, v.height() - p.height());
    vbar->setPageStep(p.height());
    updateWidgetPosition();

}